

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkTypeUtil.hpp
# Opt level: O0

VkClearValue vk::makeClearValueColor(Vec4 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  VkClearValue VVar4;
  float *pfVar5;
  Vec4 *color_local;
  VkClearValue v;
  
  pfVar5 = tcu::Vector<float,_4>::operator[](color,0);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::operator[](color,1);
  fVar2 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::operator[](color,2);
  fVar3 = *pfVar5;
  pfVar5 = tcu::Vector<float,_4>::operator[](color,3);
  VVar4.depthStencil.stencil = (deUint32)fVar2;
  VVar4.depthStencil.depth = fVar1;
  VVar4._8_4_ = fVar3;
  VVar4._12_4_ = *pfVar5;
  return VVar4;
}

Assistant:

inline VkClearValue makeClearValueColor (const tcu::Vec4& color)
{
	VkClearValue v;
	v.color.float32[0] = color[0];
	v.color.float32[1] = color[1];
	v.color.float32[2] = color[2];
	v.color.float32[3] = color[3];
	return v;
}